

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O1

void __thiscall FluidSynthMIDIDevice::FluidSynthMIDIDevice(FluidSynthMIDIDevice *this,char *args)

{
  fluid_settings_t **ppfVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  fluid_settings_t *pfVar5;
  fluid_synth_t *pfVar6;
  char *__function;
  FluidSynthMIDIDevice *this_00;
  float extraout_XMM0_Da;
  
  this_00 = this;
  SoftSynthMIDIDevice::SoftSynthMIDIDevice(&this->super_SoftSynthMIDIDevice);
  (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__FluidSynthMIDIDevice_006f4d80;
  this->FluidSettings = (fluid_settings_t *)0x0;
  this->FluidSynth = (fluid_synth_t *)0x0;
  bVar2 = LoadFluidSynth(this_00);
  if (!bVar2) {
    return;
  }
  if (FluidSynthModule.handle == (void *)0x0) {
    __function = 
    "Proto TReqProc<FluidSynthModule, fluid_settings_t *(*)()>::operator fluid_settings_t *(*)()() const [Module = FluidSynthModule, Proto = fluid_settings_t *(*)()]"
    ;
  }
  else {
    pfVar5 = (fluid_settings_t *)(*(code *)new_fluid_settings.proc.Call)();
    ppfVar1 = &this->FluidSettings;
    *ppfVar1 = pfVar5;
    iVar4 = fluid_samplerate.Value;
    if (pfVar5 == (fluid_settings_t *)0x0) {
      puts("Failed to create FluidSettings.");
      return;
    }
    (this->super_SoftSynthMIDIDevice).SampleRate = fluid_samplerate.Value;
    if (iVar4 - 0x17701U < 0xfffedf21) {
      (*GSnd->_vptr_SoundRenderer[10])();
      iVar4 = 96000;
      if ((int)extraout_XMM0_Da < 96000) {
        iVar4 = (int)extraout_XMM0_Da;
      }
      iVar3 = 0x5622;
      if (0x5622 < iVar4) {
        iVar3 = iVar4;
      }
      (this->super_SoftSynthMIDIDevice).SampleRate = iVar3;
    }
    if ((FluidSynthModule.handle == (void *)0x0) ||
       ((*(code *)fluid_settings_setnum.proc.Call)
                  (SUB84((double)(this->super_SoftSynthMIDIDevice).SampleRate,0),this->FluidSettings
                   ,"synth.sample-rate"), FluidSynthModule.handle == (void *)0x0)) {
      __function = 
      "Proto TReqProc<FluidSynthModule, int (*)(fluid_settings_t *, const char *, double)>::operator int (*)(fluid_settings_t *, const char *, double)() const [Module = FluidSynthModule, Proto = int (*)(fluid_settings_t *, const char *, double)]"
      ;
    }
    else {
      (*(code *)fluid_settings_setnum.proc.Call)
                (SUB84((double)fluid_gain.Value,0),*ppfVar1,"synth.gain");
      if ((FluidSynthModule.handle == (void *)0x0) ||
         ((((*(code *)fluid_settings_setint.proc.Call)
                      (*ppfVar1,"synth.reverb.active",fluid_reverb.Value),
           FluidSynthModule.handle == (void *)0x0 ||
           ((*(code *)fluid_settings_setint.proc.Call)
                      (*ppfVar1,"synth.chorus.active",fluid_chorus.Value),
           FluidSynthModule.handle == (void *)0x0)) ||
          ((*(code *)fluid_settings_setint.proc.Call)(*ppfVar1,"synth.polyphony",fluid_voices.Value)
          , FluidSynthModule.handle == (void *)0x0)))) {
        __function = 
        "Proto TReqProc<FluidSynthModule, int (*)(fluid_settings_t *, const char *, int)>::operator int (*)(fluid_settings_t *, const char *, int)() const [Module = FluidSynthModule, Proto = int (*)(fluid_settings_t *, const char *, int)]"
        ;
      }
      else {
        (*(code *)fluid_settings_setint.proc.Call)(*ppfVar1,"synth.cpu-cores",fluid_threads.Value);
        if (FluidSynthModule.handle == (void *)0x0) {
          __function = 
          "Proto TReqProc<FluidSynthModule, fluid_synth_t *(*)(fluid_settings_t *)>::operator fluid_synth_t *(*)(fluid_settings_t *)() const [Module = FluidSynthModule, Proto = fluid_synth_t *(*)(fluid_settings_t *)]"
          ;
        }
        else {
          pfVar6 = (fluid_synth_t *)(*(code *)new_fluid_synth.proc.Call)(*ppfVar1);
          this->FluidSynth = pfVar6;
          if (pfVar6 == (fluid_synth_t *)0x0) {
            Printf("Failed to create FluidSynth.\n");
            return;
          }
          if (FluidSynthModule.handle == (void *)0x0) {
            __function = 
            "Proto TReqProc<FluidSynthModule, int (*)(fluid_synth_t *, int, int)>::operator int (*)(fluid_synth_t *, int, int)() const [Module = FluidSynthModule, Proto = int (*)(fluid_synth_t *, int, int)]"
            ;
          }
          else {
            (*(code *)fluid_synth_set_interp_method.proc.Call)(pfVar6,0xffffffff,fluid_interp.Value)
            ;
            if (FluidSynthModule.handle == (void *)0x0) {
              __function = 
              "Proto TReqProc<FluidSynthModule, void (*)(fluid_synth_t *, double, double, double, double)>::operator void (*)(fluid_synth_t *, double, double, double, double)() const [Module = FluidSynthModule, Proto = void (*)(fluid_synth_t *, double, double, double, double)]"
              ;
            }
            else {
              (*(code *)fluid_synth_set_reverb.proc.Call)
                        (SUB84((double)fluid_reverb_roomsize.Value,0),
                         (double)fluid_reverb_damping.Value,(double)fluid_reverb_width.Value,
                         (double)fluid_reverb_level.Value,this->FluidSynth);
              if (FluidSynthModule.handle != (void *)0x0) {
                (*(code *)fluid_synth_set_chorus.proc.Call)
                          (SUB84((double)fluid_chorus_level.Value,0),
                           (double)fluid_chorus_speed.Value,(double)fluid_chorus_depth.Value,
                           this->FluidSynth,fluid_chorus_voices.Value,fluid_chorus_type.Value);
                if (((args != (char *)0x0) && (*args != '\0')) &&
                   (iVar4 = LoadPatchSets(this,args), iVar4 != 0)) {
                  return;
                }
                iVar4 = LoadPatchSets(this,fluid_patchset.Value);
                if ((iVar4 == 0) &&
                   (iVar4 = LoadPatchSets(this,
                                          "/usr/share/sounds/sf2/FluidR3_GS.sf2:/usr/share/sounds/sf2/FluidR3_GM.sf2"
                                         ), iVar4 == 0)) {
                  Printf("Failed to load any MIDI patches.\n");
                  if (FluidSynthModule.handle == (void *)0x0) {
                    __function = 
                    "Proto TReqProc<FluidSynthModule, int (*)(fluid_synth_t *)>::operator int (*)(fluid_synth_t *)() const [Module = FluidSynthModule, Proto = int (*)(fluid_synth_t *)]"
                    ;
                    goto LAB_0033dfb3;
                  }
                  (*(code *)delete_fluid_synth.proc.Call)(this->FluidSynth);
                  this->FluidSynth = (fluid_synth_t *)0x0;
                }
                return;
              }
              __function = 
              "Proto TReqProc<FluidSynthModule, void (*)(fluid_synth_t *, int, double, double, double, int)>::operator void (*)(fluid_synth_t *, int, double, double, double, int)() const [Module = FluidSynthModule, Proto = void (*)(fluid_synth_t *, int, double, double, double, int)]"
              ;
            }
          }
        }
      }
    }
  }
LAB_0033dfb3:
  __assert_fail("Module.IsLoaded()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./i_module.h"
                ,0xd2,__function);
}

Assistant:

FluidSynthMIDIDevice::FluidSynthMIDIDevice(const char *args)
{
	FluidSynth = NULL;
	FluidSettings = NULL;
#ifdef DYN_FLUIDSYNTH
	if (!LoadFluidSynth())
	{
		return;
	}
#endif
	FluidSettings = new_fluid_settings();
	if (FluidSettings == NULL)
	{
		printf("Failed to create FluidSettings.\n");
		return;
	}
	SampleRate = fluid_samplerate;
	if (SampleRate < 22050 || SampleRate > 96000)
	{ // Match sample rate to SFX rate
		SampleRate = clamp((int)GSnd->GetOutputRate(), 22050, 96000);
	}
	fluid_settings_setnum(FluidSettings, "synth.sample-rate", SampleRate);
	fluid_settings_setnum(FluidSettings, "synth.gain", fluid_gain);
	fluid_settings_setint(FluidSettings, "synth.reverb.active", fluid_reverb);
	fluid_settings_setint(FluidSettings, "synth.chorus.active", fluid_chorus);
	fluid_settings_setint(FluidSettings, "synth.polyphony", fluid_voices);
	fluid_settings_setint(FluidSettings, "synth.cpu-cores", fluid_threads);
	FluidSynth = new_fluid_synth(FluidSettings);
	if (FluidSynth == NULL)
	{
		Printf("Failed to create FluidSynth.\n");
		return;
	}
	fluid_synth_set_interp_method(FluidSynth, -1, fluid_interp);
	fluid_synth_set_reverb(FluidSynth, fluid_reverb_roomsize, fluid_reverb_damping,
		fluid_reverb_width, fluid_reverb_level);
	fluid_synth_set_chorus(FluidSynth, fluid_chorus_voices, fluid_chorus_level,
		fluid_chorus_speed, fluid_chorus_depth, fluid_chorus_type);

	// try loading a patch set that got specified with $mididevice.
	int res = 0;
	if (args != NULL && *args != 0)
	{
		res = LoadPatchSets(args);
	}

	if (res == 0 && 0 == LoadPatchSets(fluid_patchset))
	{
#ifdef __unix__
		// This is the standard location on Ubuntu.
		if (0 == LoadPatchSets("/usr/share/sounds/sf2/FluidR3_GS.sf2:/usr/share/sounds/sf2/FluidR3_GM.sf2"))
		{
#endif
#ifdef _WIN32
		// On Windows, look for the 4 megabyte patch set installed by Creative's drivers as a default.
		char sysdir[MAX_PATH+sizeof("\\CT4MGM.SF2")];
		UINT filepart;
		if (0 != (filepart = GetSystemDirectoryA(sysdir, MAX_PATH)))
		{
			strcat(sysdir, "\\CT4MGM.SF2");
			if (0 == LoadPatchSets(sysdir))
			{
				// Try again with CT2MGM.SF2
				sysdir[filepart + 3] = '2';
				if (0 == LoadPatchSets(sysdir))
				{
#endif
					Printf("Failed to load any MIDI patches.\n");
					delete_fluid_synth(FluidSynth);
					FluidSynth = NULL;
#ifdef _WIN32
				}
			}
		}
#endif
#ifdef __unix__
		}
#endif
	}
}